

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_stmt_status(sqlite3_stmt *pStmt,int op,int resetFlag)

{
  long lVar1;
  long in_FS_OFFSET;
  int local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (op == 99) {
    lVar1 = *(long *)pStmt;
    if (*(sqlite3_mutex **)(lVar1 + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar1 + 0x18));
    }
    local_1c = 0;
    *(int **)(lVar1 + 0x300) = &local_1c;
    *(undefined8 *)(lVar1 + 0x1e8) = *(undefined8 *)(lVar1 + 0x1e0);
    sqlite3VdbeDelete((Vdbe *)pStmt);
    *(undefined8 *)(lVar1 + 0x300) = 0;
    *(undefined8 *)(lVar1 + 0x1e8) = *(undefined8 *)(lVar1 + 0x1f0);
    if (*(sqlite3_mutex **)(lVar1 + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar1 + 0x18));
    }
  }
  else {
    local_1c = *(int *)(pStmt + (long)op * 4 + 0xd4);
    if (resetFlag != 0) {
      *(undefined4 *)(pStmt + (long)op * 4 + 0xd4) = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_1c;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API int sqlite3_stmt_status(sqlite3_stmt *pStmt, int op, int resetFlag){
  Vdbe *pVdbe = (Vdbe*)pStmt;
  u32 v;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !pStmt
   || (op!=SQLITE_STMTSTATUS_MEMUSED && (op<0||op>=ArraySize(pVdbe->aCounter)))
  ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  if( op==SQLITE_STMTSTATUS_MEMUSED ){
    sqlite3 *db = pVdbe->db;
    sqlite3_mutex_enter(db->mutex);
    v = 0;
    db->pnBytesFreed = (int*)&v;
    assert( db->lookaside.pEnd==db->lookaside.pTrueEnd );
    db->lookaside.pEnd = db->lookaside.pStart;
    sqlite3VdbeDelete(pVdbe);
    db->pnBytesFreed = 0;
    db->lookaside.pEnd = db->lookaside.pTrueEnd;
    sqlite3_mutex_leave(db->mutex);
  }else{
    v = pVdbe->aCounter[op];
    if( resetFlag ) pVdbe->aCounter[op] = 0;
  }
  return (int)v;
}